

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void destroy_context(Context_conflict2 *ctx)

{
  void *pvVar1;
  MOJOSHADER_free local_28;
  void *d;
  MOJOSHADER_free f;
  Context_conflict2 *ctx_local;
  
  if (ctx != (Context_conflict2 *)0x0) {
    if (ctx->free == (MOJOSHADER_free)0x0) {
      local_28 = MOJOSHADER_internal_free;
    }
    else {
      local_28 = ctx->free;
    }
    pvVar1 = ctx->malloc_data;
    preprocessor_end(ctx->preprocessor);
    errorlist_destroy(ctx->errors);
    buffer_destroy(ctx->ctab);
    buffer_destroy(ctx->token_to_source);
    buffer_destroy(ctx->output);
    (*local_28)(ctx,pvVar1);
  }
  return;
}

Assistant:

static void destroy_context(Context *ctx)
{
    if (ctx != NULL)
    {
        MOJOSHADER_free f = ((ctx->free != NULL) ? ctx->free : MOJOSHADER_internal_free);
        void *d = ctx->malloc_data;
        size_t i = 0;

        // !!! FIXME: this is kinda hacky.
        const size_t count = buffer_size(ctx->garbage) / sizeof (void *);
        if (count > 0)
        {
            void **garbage = (void **) buffer_flatten(ctx->garbage);
            if (garbage != NULL)
            {
                for (i = 0; i < count; i++)
                    f(garbage[i], d);
                f(garbage, d);
            } // if
        } // if
        buffer_destroy(ctx->garbage);

        delete_compilation_unit(ctx, (MOJOSHADER_astCompilationUnit*)ctx->ast);
        destroy_symbolmap(ctx, &ctx->usertypes);
        destroy_symbolmap(ctx, &ctx->variables);
        stringcache_destroy(ctx->strcache);
        errorlist_destroy(ctx->errors);
        errorlist_destroy(ctx->warnings);

        if (ctx->ir != NULL)
        {
            for (i = 0; i <= ctx->user_func_index; i++)
                delete_ir(ctx, ctx->ir[i]);
            f(ctx->ir, d);
        } // if

        // !!! FIXME: more to clean up here, now.

        f(ctx, d);
    } // if
}